

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig.c
# Opt level: O3

int sigMain(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  err_t eVar3;
  bool_t bVar4;
  err_t code;
  size_t sVar5;
  octet *privkey;
  char *pcVar6;
  char **ppcVar7;
  char *pcVar8;
  cmd_pwd_t pwd;
  octet date [6];
  cmd_pwd_t local_50;
  char *local_48;
  octet local_3e [6];
  size_t local_38;
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  sig sign [options] <privkey> <file>\n    sign <file> using <privkey> and attach signature\n  sig sign [options] <privkey> <file> <sig>\n    sign <file> using <privkey> and store signature in <sig>\n  sig val {-pubkey <pubkey>|-anchor <anchor>} <file>\n    verify signature attached to <file> using <pubkey> or <anchor>\n  sig val {-pubkey <pubkey>|-anchor <anchor>} <file> <sig>\n    verify <sig> of <file> using <pubkey> or <anchor>\n  sig extr {-cert<n>|-body|-sig} <sig> <obj_file>\n    extract object from <sig> and store it in <obj_file>\n      -cert<n> -- <n>th attached certificate\n        \\remark certificates are numbered from zero\n        \\remark signing certificate comes last\n      -body -- signed body\n      -sig -- signature itself\n  sig print [field] <sig>\n    print <sig> info: all fields or a specific field\n  .\n  <privkey>\n    container with private key\n  <pubkey>\n    file with public key\n  <anchor>\n    file with trusted certificate\n  options:\n    -certs <certs> -- certificate chain (optional)\n    -date <YYMMDD> -- date of signing (optional)\n    -pass <schema> -- password description\n  field:\n    {-certc|-date|-sig}\n      -certc -- number of attached certificates\n      -date -- date of signing\n      -sig -- base signature\n"
           ,"sig","sign files and verify signatures");
    return -1;
  }
  iVar1 = strCmp(argv[1],"sign");
  if (iVar1 == 0) {
    local_50 = (cmd_pwd_t)0x0;
    code = cmdStDo(8);
    if (code == 0) {
      memSet(local_3e,'\0',6);
      code = 0x25b;
      if (argc != 2) {
        ppcVar7 = argv + 2;
        iVar1 = argc + -3;
        pcVar8 = (char *)0x0;
        do {
          iVar2 = iVar1 + 1;
          bVar4 = strStartsWith(*ppcVar7,"-");
          if (bVar4 == 0) {
            if ((0xfffffffd < iVar1 - 3U) &&
               (eVar3 = 0, local_48 = pcVar8, local_50 != (cmd_pwd_t)0x0)) goto LAB_0010c4de;
            break;
          }
          if (iVar2 < 2) break;
          bVar4 = strStartsWith(*ppcVar7,"-certs");
          if (bVar4 == 0) {
            bVar4 = strStartsWith(*ppcVar7,"-date");
            if (bVar4 == 0) {
              local_48 = pcVar8;
              bVar4 = strStartsWith(*ppcVar7,"-pass");
              if (bVar4 != 0) {
                pcVar8 = local_48;
                if (local_50 == (cmd_pwd_t)0x0) {
                  eVar3 = cmdPwdRead(&local_50,ppcVar7[1]);
                  goto LAB_0010c2b9;
                }
                goto LAB_0010c4b6;
              }
              eVar3 = 0x25b;
            }
            else {
              local_48 = pcVar8;
              bVar4 = memIsZero(local_3e,6);
              pcVar8 = local_48;
              if (bVar4 == 0) {
LAB_0010c4b6:
                local_48 = pcVar8;
                eVar3 = 0x25c;
              }
              else {
                eVar3 = cmdDateParse(local_3e,ppcVar7[1]);
LAB_0010c2b9:
                pcVar8 = local_48;
                if (eVar3 == 0) goto LAB_0010c2c6;
                ppcVar7 = ppcVar7 + 1;
                iVar2 = iVar1;
              }
            }
LAB_0010c4de:
            if (iVar2 == 3) {
              bVar4 = cmdFileAreSame(ppcVar7[1],ppcVar7[2]);
              code = 0xd3;
              if (bVar4 != 0) break;
            }
            code = eVar3;
            if (((eVar3 == 0) && (code = cmdFileValExist(2,ppcVar7), code == 0)) &&
               ((iVar2 != 3 || (code = cmdFileValNotExist(1,ppcVar7 + 2), code == 0)))) {
              local_38 = 0;
              code = cmdPrivkeyRead((octet *)0x0,&local_38,*ppcVar7,local_50);
              if (code == 0) {
                privkey = (octet *)blobCreate(local_38);
                if (privkey == (octet *)0x0) {
                  cmdPwdClose(local_50);
                  goto LAB_0010c62a;
                }
                code = cmdPrivkeyRead(privkey,(size_t *)0x0,*ppcVar7,local_50);
                cmdPwdClose(local_50);
                if (code == 0) {
                  code = cmdSigSign(ppcVar7[(ulong)(iVar2 == 3) + 1],ppcVar7[1],local_48,local_3e,
                                    privkey,local_38);
                }
                goto LAB_0010c652;
              }
            }
            break;
          }
          if (pcVar8 != (char *)0x0) goto LAB_0010c4b6;
          pcVar8 = ppcVar7[1];
LAB_0010c2c6:
          ppcVar7 = ppcVar7 + 2;
          iVar1 = iVar1 + -2;
        } while (iVar1 != -1);
      }
      cmdPwdClose(local_50);
    }
  }
  else {
    iVar1 = strCmp(argv[1],"val");
    if (iVar1 != 0) {
      iVar1 = strCmp(argv[1],"extr");
      if (iVar1 == 0) {
        code = 0x25b;
        iVar1 = -1;
        if (argc != 5) goto LAB_0010c566;
        pcVar8 = argv[2];
        sVar5 = strLen(pcVar8);
        if ((sVar5 == 0) || (*pcVar8 != '-')) goto LAB_0010c566;
        code = cmdFileValExist(1,argv + 3);
        if (code == 0) {
          code = cmdFileValNotExist(1,argv + 4);
          if (code == 0) {
            code = cmdSigExtr(argv[4],argv[3],pcVar8 + 1);
            goto LAB_0010c55b;
          }
        }
      }
      else {
        iVar2 = strCmp(argv[1],"print");
        code = 0x259;
        iVar1 = -1;
        if ((iVar2 != 0) || (code = 0x25b, argc - 5U < 0xfffffffe)) goto LAB_0010c566;
        ppcVar7 = argv + 2;
        if (argc == 4) {
          pcVar8 = *ppcVar7;
          sVar5 = strLen(pcVar8);
          if ((sVar5 == 0) || (*pcVar8 != '-')) goto LAB_0010c566;
          pcVar8 = pcVar8 + 1;
          ppcVar7 = argv + 3;
        }
        else {
          pcVar8 = (char *)0x0;
        }
        code = cmdFileValExist(1,ppcVar7);
        if (code == 0) {
          code = cmdSigPrint(*ppcVar7,pcVar8);
          goto LAB_0010c55b;
        }
      }
      iVar1 = -1;
      goto LAB_0010c566;
    }
    code = cmdStDo(8);
    if (((code == 0) && (code = 0x25b, 0xfffffffd < argc - 7U)) &&
       ((iVar1 = strCmp(argv[2],"-pubkey"), iVar1 == 0 ||
        (iVar1 = strCmp(argv[2],"-anchor"), iVar1 == 0)))) {
      if (argc == 6) {
        bVar4 = cmdFileAreSame(argv[4],argv[5]);
        code = 0xd3;
        if (bVar4 != 0) goto LAB_0010c55b;
      }
      ppcVar7 = argv + 3;
      code = cmdFileValExist(argc + -3,ppcVar7);
      if ((code == 0) &&
         (code = cmdFileReadAll((void *)0x0,(size_t *)&local_50,*ppcVar7), code == 0)) {
        privkey = (octet *)blobCreate((size_t)local_50);
        if (privkey == (octet *)0x0) {
LAB_0010c62a:
          code = 0x6e;
        }
        else {
          code = cmdFileReadAll(privkey,(size_t *)&local_50,*ppcVar7);
          if (code == 0) {
            iVar1 = strCmp(argv[2],"-pubkey");
            pcVar8 = argv[4];
            if (iVar1 == 0) {
              pcVar6 = pcVar8;
              if (argc == 6) {
                pcVar6 = argv[5];
              }
              code = cmdSigVerify(pcVar8,pcVar6,privkey,(size_t)local_50);
            }
            else {
              pcVar6 = pcVar8;
              if (argc == 6) {
                pcVar6 = argv[5];
              }
              code = cmdSigVerify2(pcVar8,pcVar6,privkey,(size_t)local_50);
            }
          }
LAB_0010c652:
          blobClose(privkey);
        }
      }
    }
  }
LAB_0010c55b:
  iVar1 = -1;
  if (code == 0) {
    iVar2 = strCmp(argv[1],"val");
    iVar1 = 0;
    code = 0;
    if (iVar2 != 0) {
      return 0;
    }
  }
LAB_0010c566:
  pcVar8 = errMsg(code);
  printf("bee2cmd/%s: %s\n","sig",pcVar8);
  return iVar1;
}

Assistant:

static int sigMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return sigUsage();
	// разбор команды
	--argc, ++argv;
	if (strEq(argv[0], "sign"))
		code = sigSign(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))	
		code = sigVal(argc - 1, argv + 1);
	else if (strEq(argv[0], "extr"))
		code = sigExtr(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = sigPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}